

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O1

void asio::detail::
     wait_handler<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  ptr p;
  handler_work<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_asio::any_io_executor,_void>
  w;
  ptr local_98;
  any_executor_base local_80;
  scheduler_operation *local_50;
  undefined1 local_48 [16];
  _Head_base<0UL,_nuraft::asio_service_impl_*,_false> local_38;
  scheduler_operation *local_30;
  error_category *peStack_28;
  
  local_98.h = (_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>
                *)(base + 2);
  local_98.v = (wait_handler<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_asio::any_io_executor>
                *)base;
  local_98.p = (wait_handler<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_asio::any_io_executor>
                *)base;
  execution::detail::any_executor_base::any_executor_base(&local_80,(any_executor_base *)(base + 3))
  ;
  local_50 = base[5].next_;
  base[5].next_ =
       (scheduler_operation *)
       execution::
       any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
       ::prop_fns_table<void>()::fns;
  local_48._0_8_ = base[2].next_;
  local_48._8_8_ = base[2].func_;
  local_98.h = (_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>
                *)local_48;
  local_38._M_head_impl = *(asio_service_impl **)&base[2].task_result_;
  local_30 = base[1].next_;
  peStack_28 = (error_category *)base[1].func_;
  ptr::reset(&local_98);
  if (owner != (void *)0x0) {
    handler_work<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,asio::any_io_executor,void>
    ::
    complete<asio::detail::binder1<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,std::error_code>>
              ((handler_work<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,asio::any_io_executor,void>
                *)&local_80,
               (binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
                *)local_48,
               (_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>
                *)local_48);
  }
  (*(local_80.object_fns_)->destroy)(&local_80);
  ptr::reset(&local_98);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }